

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::~OmegaOP(OmegaOP *this)

{
  pointer pdVar1;
  pointer piVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  
  if (this->states != (double *)0x0) {
    operator_delete(this->states);
  }
  this->states = (double *)0x0;
  lVar3 = 0;
  do {
    if (this->S12P[lVar3] != (double *)0x0) {
      operator_delete(this->S12P[lVar3]);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (this->nbStates != 0) {
    uVar4 = 0;
    do {
      if (this->Q[uVar4] != (double *)0x0) {
        operator_delete(this->Q[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->nbStates);
  }
  if (this->nbStates != 0) {
    uVar4 = 0;
    do {
      if (this->lastChpt[uVar4] != (uint *)0x0) {
        operator_delete(this->lastChpt[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->nbStates);
  }
  if (this->nbStates != 0) {
    uVar4 = 0;
    do {
      if (this->lastIndState[uVar4] != (uint *)0x0) {
        operator_delete(this->lastIndState[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->nbStates);
  }
  if (this->S12P != (double **)0x0) {
    operator_delete__(this->S12P);
  }
  this->S12P = (double **)0x0;
  if (this->Q != (double **)0x0) {
    operator_delete__(this->Q);
  }
  this->Q = (double **)0x0;
  if (this->lastChpt != (uint **)0x0) {
    operator_delete__(this->lastChpt);
  }
  this->lastChpt = (uint **)0x0;
  if (this->lastIndState != (uint **)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->lastIndState = (uint **)0x0;
  pdVar1 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  piVar2 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

OmegaOP::~OmegaOP()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(Q[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastChpt[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastIndState[i]);}
  delete [] S12P;
  S12P = NULL;
  delete [] Q;
  Q = NULL;
  delete [] lastChpt;
  lastChpt = NULL;
  delete [] lastIndState;
  lastIndState = NULL;
}